

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall
Darts::Details::DoubleArrayBuilder::arrange_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  bool bVar1;
  id_type id;
  uint id_00;
  int value;
  DoubleArrayBuilderUnit *pDVar2;
  size_t sVar3;
  byte *pbVar4;
  uchar *puVar5;
  extra_type *this_00;
  ulong uStack_38;
  id_type dic_child_id;
  size_t i;
  uchar_type local_25;
  id_type offset;
  id_type local_20;
  id_type dawg_child_id;
  id_type dic_id_local;
  id_type dawg_id_local;
  DawgBuilder *dawg_local;
  DoubleArrayBuilder *this_local;
  
  local_20 = dic_id;
  dawg_child_id = dawg_id;
  _dic_id_local = dawg;
  dawg_local = (DawgBuilder *)this;
  AutoPool<unsigned_char>::resize(&this->labels_,0);
  for (offset = DawgBuilder::child(_dic_id_local,dawg_child_id); offset != 0;
      offset = DawgBuilder::sibling(_dic_id_local,offset)) {
    local_25 = DawgBuilder::label(_dic_id_local,offset);
    AutoPool<unsigned_char>::append(&this->labels_,&local_25);
  }
  id = find_valid_offset(this,local_20);
  pDVar2 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                     (&this->units_,(ulong)local_20);
  DoubleArrayBuilderUnit::set_offset(pDVar2,local_20 ^ id);
  offset = DawgBuilder::child(_dic_id_local,dawg_child_id);
  uStack_38 = 0;
  while( true ) {
    sVar3 = AutoPool<unsigned_char>::size(&this->labels_);
    if (sVar3 <= uStack_38) break;
    pbVar4 = AutoPool<unsigned_char>::operator[](&this->labels_,uStack_38);
    id_00 = id ^ *pbVar4;
    reserve_id(this,id_00);
    bVar1 = DawgBuilder::is_leaf(_dic_id_local,offset);
    if (bVar1) {
      pDVar2 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                         (&this->units_,(ulong)local_20);
      DoubleArrayBuilderUnit::set_has_leaf(pDVar2,true);
      pDVar2 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                         (&this->units_,(ulong)id_00);
      value = DawgBuilder::value(_dic_id_local,offset);
      DoubleArrayBuilderUnit::set_value(pDVar2,value);
    }
    else {
      pDVar2 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                         (&this->units_,(ulong)id_00);
      puVar5 = AutoPool<unsigned_char>::operator[](&this->labels_,uStack_38);
      DoubleArrayBuilderUnit::set_label(pDVar2,*puVar5);
    }
    offset = DawgBuilder::sibling(_dic_id_local,offset);
    uStack_38 = uStack_38 + 1;
  }
  this_00 = extras(this,id);
  DoubleArrayBuilderExtraUnit::set_is_used(this_00,true);
  return id;
}

Assistant:

inline id_type DoubleArrayBuilder::arrange_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  labels_.resize(0);

  id_type dawg_child_id = dawg.child(dawg_id);
  while (dawg_child_id != 0) {
    labels_.append(dawg.label(dawg_child_id));
    dawg_child_id = dawg.sibling(dawg_child_id);
  }

  id_type offset = find_valid_offset(dic_id);
  units_[dic_id].set_offset(dic_id ^ offset);

  dawg_child_id = dawg.child(dawg_id);
  for (std::size_t i = 0; i < labels_.size(); ++i) {
    id_type dic_child_id = offset ^ labels_[i];
    reserve_id(dic_child_id);

    if (dawg.is_leaf(dawg_child_id)) {
      units_[dic_id].set_has_leaf(true);
      units_[dic_child_id].set_value(dawg.value(dawg_child_id));
    } else {
      units_[dic_child_id].set_label(labels_[i]);
    }

    dawg_child_id = dawg.sibling(dawg_child_id);
  }
  extras(offset).set_is_used(true);

  return offset;
}